

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelper.cpp
# Opt level: O3

void __thiscall
phpconvert::StringHelper::split
          (StringHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out,string *delim,string *source)

{
  long lVar1;
  anon_union_16_2_ba345be5_for_m_Storage local_40;
  ulong local_30;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(out);
  lVar1 = std::__cxx11::string::find((char *)source,(ulong)(delim->_M_dataplus)._M_p,0);
  if (lVar1 != -1) {
    local_28.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin._M_current = (delim->_M_dataplus)._M_p;
    local_28.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_End._M_current =
         local_28.
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
         .
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
         .
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin._M_current + delim->_M_string_length;
    boost::algorithm::detail::is_any_ofF<char>::
    is_any_ofF<boost::iterator_range<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              ((is_any_ofF<char> *)&local_40,&local_28);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
              (out,source,(is_any_ofF<char> *)&local_40,token_compress_on);
    if ((0x10 < local_30) && (local_40.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_40.m_dynSet);
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(out,source);
  return;
}

Assistant:

void StringHelper::split(vector<string>& out, const string& delim, const string& source) {
	out.clear();
	if (source.find(delim) != string::npos)
		boost::split(out, source, is_any_of(delim), token_compress_on);
	else
		out.push_back(source);
}